

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canal.cc
# Opt level: O0

void search<OffsetBoundSymbolMatcher,unsigned_int>
               (csptr *view,OffsetBoundSymbolMatcher *m,Addr loc,AddressRanges *searchaddrs,
               SymbolStore *store,bool showaddrs)

{
  bool bVar1;
  element_type *reader_;
  size_type sVar2;
  uint *puVar3;
  ostream *poVar4;
  void *pvVar5;
  difference_type dVar6;
  __tuple_element_t<0UL,_tuple<bool,_ListedSymbol_*>_> *p_Var7;
  __tuple_element_t<1UL,_tuple<bool,_ListedSymbol_*>_> *ppLVar8;
  ulong uVar9;
  Off OVar10;
  OffsetBoundSymbolMatcher match;
  iterator iVar11;
  exception *ex;
  type *sym;
  type_conflict *found;
  undefined1 auStack_801f0 [24];
  uint p_1;
  iterator cur_1;
  pair<unsigned_long,_unsigned_long> *range;
  const_iterator __end4;
  const_iterator __begin4;
  AddressRanges *__range4;
  uint p;
  iterator cur;
  iterator start;
  ReaderArray<unsigned_int,_131072UL> r;
  undefined1 local_148 [8];
  IOFlagSave _;
  bool showaddrs_local;
  SymbolStore *store_local;
  AddressRanges *searchaddrs_local;
  Addr loc_local;
  OffsetBoundSymbolMatcher *m_local;
  csptr *view_local;
  
  _._271_1_ = showaddrs;
  pstack::IOFlagSave::IOFlagSave
            ((IOFlagSave *)local_148,(ios *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  reader_ = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)view);
  pstack::ReaderArray<unsigned_int,_131072UL>::ReaderArray
            ((ReaderArray<unsigned_int,_131072UL> *)&start.idx,reader_,0);
  iVar11 = pstack::ReaderArray<unsigned_int,_131072UL>::begin
                     ((ReaderArray<unsigned_int,_131072UL> *)&start.idx);
  start.arrayp = (ReaderArray<unsigned_int,_131072UL> *)iVar11.idx;
  cur.idx = (size_t)iVar11.arrayp;
  sVar2 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::size(searchaddrs);
  if (sVar2 == 0) {
    _p_1 = (ReaderArray<unsigned_int,_131072UL> *)cur.idx;
    cur_1.arrayp = start.arrayp;
    while( true ) {
      pstack::ReaderArray<unsigned_int,_131072UL>::end
                ((ReaderArray<unsigned_int,_131072UL> *)&start.idx);
      bVar1 = pstack::ReaderArray<unsigned_int,_131072UL>::iterator::operator!=
                        ((iterator *)&p_1,(sentinel *)(auStack_801f0 + 0x17));
      if (!bVar1) break;
      puVar3 = pstack::ReaderArray<unsigned_int,_131072UL>::iterator::operator*((iterator *)&p_1);
      auStack_801f0._16_4_ = *puVar3;
      match.offset_._4_4_ = 0;
      match.offset_._0_4_ = auStack_801f0._16_4_;
      SymbolStore::find<OffsetBoundSymbolMatcher>((SymbolStore *)auStack_801f0,(Off)store,match);
      p_Var7 = std::get<0ul,bool,ListedSymbol*>((tuple<bool,_ListedSymbol_*> *)auStack_801f0);
      ppLVar8 = std::get<1ul,bool,ListedSymbol*>((tuple<bool,_ListedSymbol_*> *)auStack_801f0);
      if ((*p_Var7 & 1U) != 0) {
        if ((_._271_1_ & 1) != 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)&(*ppLVar8)->name);
          poVar4 = std::operator<<(poVar4," 0x");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
          dVar6 = pstack::ReaderArray<unsigned_int,_131072UL>::iterator::operator-
                            ((iterator *)&p_1,(iterator *)&cur.idx);
          pvVar5 = (void *)std::ostream::operator<<(pvVar5,loc + dVar6 * 4);
          poVar4 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
          poVar4 = std::operator<<(poVar4," ... size=");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,((*ppLVar8)->sym).st_size);
          poVar4 = std::operator<<(poVar4,", diff=");
          uVar9 = (ulong)(uint)auStack_801f0._16_4_;
          OVar10 = ListedSymbol::memaddr(*ppLVar8);
          pvVar5 = (void *)std::ostream::operator<<(poVar4,uVar9 - OVar10);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        }
        (*ppLVar8)->count = (*ppLVar8)->count + 1;
      }
      pstack::ReaderArray<unsigned_int,_131072UL>::iterator::operator++((iterator *)&p_1);
    }
  }
  else {
    _p = (ReaderArray<unsigned_int,_131072UL> *)cur.idx;
    cur.arrayp = start.arrayp;
    while( true ) {
      pstack::ReaderArray<unsigned_int,_131072UL>::end
                ((ReaderArray<unsigned_int,_131072UL> *)&start.idx);
      bVar1 = pstack::ReaderArray<unsigned_int,_131072UL>::iterator::operator!=
                        ((iterator *)&p,(sentinel *)((long)&__range4 + 7));
      if (!bVar1) break;
      puVar3 = pstack::ReaderArray<unsigned_int,_131072UL>::iterator::operator*((iterator *)&p);
      __range4._0_4_ = *puVar3;
      __end4 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::begin(searchaddrs);
      range = (pair<unsigned_long,_unsigned_long> *)
              std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::end(searchaddrs);
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                               (&__end4,(__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                         *)&range), ((bVar1 ^ 0xffU) & 1) != 0) {
        cur_1.idx = (size_t)__gnu_cxx::
                            __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                            ::operator*(&__end4);
        if ((((reference)cur_1.idx)->first <= (ulong)(uint)__range4) &&
           ((ulong)(uint)__range4 < ((reference)cur_1.idx)->second)) {
          poVar4 = std::operator<<((ostream *)&std::cout,"0x");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
          dVar6 = pstack::ReaderArray<unsigned_int,_131072UL>::iterator::operator-
                            ((iterator *)&p,(iterator *)&cur.idx);
          pvVar5 = (void *)std::ostream::operator<<(pvVar5,loc + dVar6 * 4);
          poVar4 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
          std::operator<<(poVar4,"\n");
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::operator++(&__end4);
      }
      pstack::ReaderArray<unsigned_int,_131072UL>::iterator::operator++((iterator *)&p);
    }
  }
  pstack::IOFlagSave::~IOFlagSave((IOFlagSave *)local_148);
  return;
}

Assistant:

inline void search(
        const Reader::csptr &view,
        const Matcher & m,
        Elf::Addr loc,
        const AddressRanges &searchaddrs,
        SymbolStore &store,
        bool showaddrs) {
    try {
        IOFlagSave _(cout);
        ReaderArray<Word, 131072> r(*view, 0);
        auto start = r.begin();
        if (searchaddrs.size()) {
            for (auto cur = start; cur != r.end(); ++cur) {
                Word p = *cur;
                for (const auto &range : searchaddrs )
                    if (p >= range.first && p < range.second)
                        cout << "0x" << hex << loc + (cur - start) * sizeof( Word) << dec << "\n";
            }
        } else {
            for (auto cur = start; cur != r.end(); ++cur) {
                Word p = *cur;
                if ( auto [ found, sym ] = store.find(p, m); found) {
                    if (showaddrs)
                        cout
                            << sym->name << " 0x" << std::hex << loc + (cur - start) * sizeof(Word)
                            << std::dec <<  " ... size=" << sym->sym.st_size
                            << ", diff=" << p - sym->memaddr() << endl;
#ifdef WITH_PYTHON
                    if (py) {
                        std::cout << "pyo " << Elf::Addr(loc) << " ";
                        py->print(Elf::Addr(loc) - sizeof (PyObject) +
                                sizeof (struct _typeobject *));
                        std::cout << "\n";
                    }
#endif
                    sym->count++;
                }
            }
        }
    } catch (const std::exception &ex) {
        std::clog << "warning: error reading data at " << std::hex << loc << std::dec << ": " << ex.what() << "\n";
    }
}